

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TimingOf<std::chrono::_V2::steady_clock,_const_Catch::Benchmark::Detail::BenchmarkFunction_&,_run_for_at_least_argument_t<steady_clock,_const_BenchmarkFunction_&>_>
 Catch::Benchmark::Detail::
 run_for_at_least<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::BenchmarkFunction_const&>
           (ClockDuration<std::chrono::_V2::steady_clock> how_long,int seed,BenchmarkFunction *fun)

{
  _Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false> _Var1;
  long lVar2;
  ulong uVar3;
  ulong unaff_R12;
  duration<long,_std::ratio<1L,_1000000000L>_> unaff_R15;
  TimingOf<std::chrono::_V2::steady_clock,_const_Catch::Benchmark::Detail::BenchmarkFunction_&,_run_for_at_least_argument_t<steady_clock,_const_BenchmarkFunction_&>_>
  TVar4;
  optimized_away_error local_48;
  long local_40;
  long lStack_38;
  
  uVar3 = (ulong)(uint)seed;
  do {
    if (0x3fffffff < (int)uVar3) {
      local_48 = (optimized_away_error)&PTR__exception_001da588;
      throw_exception<Catch::Benchmark::Detail::optimized_away_error>(&local_48);
    }
    local_48 = (optimized_away_error)&PTR_start_001da5b0;
    local_40 = 0;
    lStack_38 = 0;
    _Var1._M_head_impl =
         (fun->f)._M_t.
         super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
         ._M_t.
         super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
         .super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
         _M_head_impl;
    (**(_Var1._M_head_impl)->_vptr_callable)(_Var1._M_head_impl,&local_48,uVar3);
    lVar2 = lStack_38 - local_40;
    if (how_long.__r <= lVar2) {
      unaff_R15.__r = lVar2;
    }
    unaff_R12 = unaff_R12 & 0xffffffff;
    if (how_long.__r <= lVar2) {
      unaff_R12 = uVar3;
    }
    uVar3 = (ulong)(uint)((int)uVar3 << (lVar2 < how_long.__r));
  } while (lVar2 < how_long.__r);
  TVar4._8_8_ = unaff_R12 << 0x20;
  TVar4.elapsed.__r = unaff_R15.__r;
  return TVar4;
}

Assistant:

TimingOf<Clock, Fun, run_for_at_least_argument_t<Clock, Fun>> run_for_at_least(ClockDuration<Clock> how_long, int seed, Fun&& fun) {
                auto iters = seed;
                while (iters < (1 << 30)) {
                    auto&& Timing = measure_one<Clock>(fun, iters, is_callable<Fun(Chronometer)>());

                    if (Timing.elapsed >= how_long) {
                        return { Timing.elapsed, std::move(Timing.result), iters };
                    }
                    iters *= 2;
                }
                Catch::throw_exception(optimized_away_error{});
            }